

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QString * __thiscall QFileDialog::selectedMimeTypeFilter(QFileDialog *this)

{
  initializer_list<QString> args;
  bool bVar1;
  QString *pQVar2;
  QString *pQVar3;
  QFileDialog *in_RDI;
  long in_FS_OFFSET;
  QString *mimeType;
  QStringList *__range2;
  QFileDialogPrivate *d;
  QString *mimeTypeFilter;
  QString filter;
  const_iterator __end2;
  const_iterator __begin2;
  QStringList mimeTypes;
  QString nameFilter;
  undefined4 in_stack_fffffffffffffe98;
  Option in_stack_fffffffffffffe9c;
  QFileDialogPrivate *in_stack_fffffffffffffea0;
  QFileDialogPrivate *in_stack_fffffffffffffea8;
  QFileDialogPrivate *in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb8;
  byte bVar4;
  byte bVar5;
  QFileDialog *this_00;
  QString local_b0;
  QString *local_98;
  const_iterator local_90;
  const_iterator local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 local_20 [32];
  
  local_20._24_8_ = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QFileDialog *)0x757d95);
  *(Data **)&(this_00->super_QDialog).super_QWidget = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this_00->super_QDialog).super_QWidget.field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this_00->super_QDialog).super_QWidget.super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa
  ;
  QString::QString((QString *)0x757dc9);
  bVar1 = QFileDialogPrivate::usingWidgets(in_stack_fffffffffffffea0);
  if (!bVar1) {
    QFileDialogPrivate::selectedMimeTypeFilter_sys(in_stack_fffffffffffffea8);
    QString::operator=((QString *)in_stack_fffffffffffffea0,
                       (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    QString::~QString((QString *)0x757e08);
  }
  bVar1 = QString::isNull((QString *)0x757e12);
  bVar4 = 0;
  bVar5 = bVar4;
  if (bVar1) {
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x757e37);
    QFileDialogOptions::mimeTypeFilters();
    bVar1 = QList<QString>::isEmpty((QList<QString> *)0x757e59);
    bVar4 = bVar1 ^ 0xff;
    bVar5 = bVar4;
    QList<QString>::~QList((QList<QString> *)0x757e7d);
  }
  if ((bVar4 & 1) != 0) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    selectedNameFilter(this_00);
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x757f07);
    QFileDialogOptions::mimeTypeFilters();
    local_88.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffea0);
    local_90.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_90 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffea0);
    while( true ) {
      local_98 = local_90.i;
      bVar1 = QList<QString>::const_iterator::operator!=(&local_88,local_90);
      if (!bVar1) break;
      pQVar2 = QList<QString>::const_iterator::operator*(&local_88);
      local_b0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b0.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_b0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      nameFilterForMime((QString *)in_stack_fffffffffffffea8);
      bVar1 = testOption((QFileDialog *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      if (bVar1) {
        QString::QString((QString *)in_stack_fffffffffffffea0,
                         (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        args._M_len._0_6_ = in_stack_fffffffffffffeb8;
        args._M_array = (iterator)in_stack_fffffffffffffeb0;
        args._M_len._6_1_ = bVar4;
        args._M_len._7_1_ = bVar5;
        QList<QString>::QList((QList<QString> *)in_stack_fffffffffffffea8,args);
        qt_strip_filters((QStringList *)in_RDI);
        pQVar3 = QList<QString>::constFirst((QList<QString> *)in_stack_fffffffffffffea0);
        QString::operator=(&local_b0,(QString *)pQVar3);
        QList<QString>::~QList((QList<QString> *)0x75809c);
        QList<QString>::~QList((QList<QString> *)0x7580a9);
        in_stack_fffffffffffffea8 = (QFileDialogPrivate *)local_20;
        in_stack_fffffffffffffea0 = (QFileDialogPrivate *)(local_20 + 0x18);
        do {
          in_stack_fffffffffffffea0 =
               (QFileDialogPrivate *)&in_stack_fffffffffffffea0[-1].sidebarUrls.d.size;
          QString::~QString((QString *)0x7580d2);
          in_stack_fffffffffffffeb0 = in_stack_fffffffffffffea0;
        } while (in_stack_fffffffffffffea0 != in_stack_fffffffffffffea8);
      }
      bVar1 = ::operator==((QString *)in_stack_fffffffffffffea0,
                           (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
      ;
      if (bVar1) {
        QString::operator=((QString *)this_00,(QString *)pQVar2);
      }
      QString::~QString((QString *)0x758131);
      if (bVar1) break;
      QList<QString>::const_iterator::operator++(&local_88);
    }
    QList<QString>::~QList((QList<QString> *)0x75815e);
    QString::~QString((QString *)0x75816b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20._24_8_) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileDialog::selectedMimeTypeFilter() const
{
    Q_D(const QFileDialog);
    QString mimeTypeFilter;
    if (!d->usingWidgets())
        mimeTypeFilter = d->selectedMimeTypeFilter_sys();

#if QT_CONFIG(mimetype)
    if (mimeTypeFilter.isNull() && !d->options->mimeTypeFilters().isEmpty()) {
        const auto nameFilter = selectedNameFilter();
        const auto mimeTypes = d->options->mimeTypeFilters();
        for (const auto &mimeType: mimeTypes) {
            QString filter = nameFilterForMime(mimeType);
            if (testOption(HideNameFilterDetails))
                filter = qt_strip_filters({ filter }).constFirst();
            if (filter == nameFilter) {
                mimeTypeFilter = mimeType;
                break;
            }
        }
    }
#endif

    return mimeTypeFilter;
}